

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O0

char * Scl_LibertyReadCellLeakage(Scl_Tree_t *p,Scl_Item_t *pCell)

{
  int iVar1;
  char *pcVar2;
  Scl_Item_t *local_30;
  Scl_Item_t *pChild;
  Scl_Item_t *pItem;
  Scl_Item_t *pCell_local;
  Scl_Tree_t *p_local;
  
  pChild = Scl_LibertyItem(p,pCell->Child);
  while( true ) {
    if (pChild == (Scl_Item_t *)0x0) {
      pChild = Scl_LibertyItem(p,pCell->Child);
      do {
        if (pChild == (Scl_Item_t *)0x0) {
          return (char *)0x0;
        }
        iVar1 = Scl_LibertyCompare(p,pChild->Key,"leakage_power");
        if (iVar1 == 0) {
          local_30 = Scl_LibertyItem(p,pChild->Child);
          while ((local_30 != (Scl_Item_t *)0x0 &&
                 (iVar1 = Scl_LibertyCompare(p,local_30->Key,"when"), iVar1 != 0))) {
            local_30 = Scl_LibertyItem(p,local_30->Next);
          }
          if ((local_30 == (Scl_Item_t *)0x0) ||
             (iVar1 = Scl_LibertyCompare(p,local_30->Key,"when"), iVar1 != 0)) {
            for (local_30 = Scl_LibertyItem(p,pChild->Child); local_30 != (Scl_Item_t *)0x0;
                local_30 = Scl_LibertyItem(p,local_30->Next)) {
              iVar1 = Scl_LibertyCompare(p,local_30->Key,"value");
              if (iVar1 == 0) {
                pcVar2 = Scl_LibertyReadString(p,local_30->Head);
                return pcVar2;
              }
            }
          }
        }
        pChild = Scl_LibertyItem(p,pChild->Next);
      } while( true );
    }
    iVar1 = Scl_LibertyCompare(p,pChild->Key,"cell_leakage_power");
    if (iVar1 == 0) break;
    pChild = Scl_LibertyItem(p,pChild->Next);
  }
  pcVar2 = Scl_LibertyReadString(p,pChild->Head);
  return pcVar2;
}

Assistant:

char * Scl_LibertyReadCellLeakage( Scl_Tree_t * p, Scl_Item_t * pCell )
{
    Scl_Item_t * pItem, * pChild;
    Scl_ItemForEachChildName( p, pCell, pItem, "cell_leakage_power" )
        return Scl_LibertyReadString(p, pItem->Head);
    // look for another type
    Scl_ItemForEachChildName( p, pCell, pItem, "leakage_power" )
    {
        Scl_ItemForEachChildName( p, pItem, pChild, "when" )
            break;
        if ( pChild && !Scl_LibertyCompare(p, pChild->Key, "when") )
            continue;
        Scl_ItemForEachChildName( p, pItem, pChild, "value" )
            return Scl_LibertyReadString(p, pChild->Head);
    }
    return 0;
}